

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-md5.c
# Opt level: O0

void pp_crypto_hash_md5_process(PHashMD5 *ctx,puint32 *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  puint32 D;
  puint32 C;
  puint32 B;
  puint32 A;
  puint32 *data_local;
  PHashMD5 *ctx_local;
  
  uVar4 = ctx->hash[1];
  uVar3 = ctx->hash[2];
  uVar2 = ctx->hash[3];
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + *data + -0x28955b88 + ctx->hash[0];
  uVar1 = (uVar1 * 0x80 | uVar1 >> 0x19) + uVar4;
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + data[1] + -0x173848aa + uVar2;
  uVar2 = (uVar2 * 0x1000 | uVar2 >> 0x14) + uVar1;
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + data[2] + 0x242070db + uVar3;
  uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) + uVar2;
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + data[3] + -0x3e423112 + uVar4;
  uVar4 = (uVar4 * 0x400000 | uVar4 >> 10) + uVar3;
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + data[4] + -0xa83f051 + uVar1;
  uVar1 = (uVar1 * 0x80 | uVar1 >> 0x19) + uVar4;
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + data[5] + 0x4787c62a + uVar2;
  uVar2 = (uVar2 * 0x1000 | uVar2 >> 0x14) + uVar1;
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + data[6] + -0x57cfb9ed + uVar3;
  uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) + uVar2;
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + data[7] + -0x2b96aff + uVar4;
  uVar4 = (uVar4 * 0x400000 | uVar4 >> 10) + uVar3;
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + data[8] + 0x698098d8 + uVar1;
  uVar1 = (uVar1 * 0x80 | uVar1 >> 0x19) + uVar4;
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + data[9] + -0x74bb0851 + uVar2;
  uVar2 = (uVar2 * 0x1000 | uVar2 >> 0x14) + uVar1;
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + data[10] + -0xa44f + uVar3;
  uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) + uVar2;
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + data[0xb] + -0x76a32842 + uVar4;
  uVar4 = (uVar4 * 0x400000 | uVar4 >> 10) + uVar3;
  uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + data[0xc] + 0x6b901122 + uVar1;
  uVar1 = (uVar1 * 0x80 | uVar1 >> 0x19) + uVar4;
  uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + data[0xd] + -0x2678e6d + uVar2;
  uVar2 = (uVar2 * 0x1000 | uVar2 >> 0x14) + uVar1;
  uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + data[0xe] + -0x5986bc72 + uVar3;
  uVar3 = (uVar3 * 0x20000 | uVar3 >> 0xf) + uVar2;
  uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + data[0xf] + 0x49b40821 + uVar4;
  uVar4 = (uVar4 * 0x400000 | uVar4 >> 10) + uVar3;
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + data[1] + -0x9e1da9e + uVar1;
  uVar1 = (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + data[6] + -0x3fbf4cc0 + uVar2;
  uVar2 = (uVar2 * 0x200 | uVar2 >> 0x17) + uVar1;
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + data[0xb] + 0x265e5a51 + uVar3;
  uVar3 = (uVar3 * 0x4000 | uVar3 >> 0x12) + uVar2;
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + *data + -0x16493856 + uVar4;
  uVar4 = (uVar4 * 0x100000 | uVar4 >> 0xc) + uVar3;
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + data[5] + -0x29d0efa3 + uVar1;
  uVar1 = (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + data[10] + 0x2441453 + uVar2;
  uVar2 = (uVar2 * 0x200 | uVar2 >> 0x17) + uVar1;
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + data[0xf] + -0x275e197f + uVar3;
  uVar3 = (uVar3 * 0x4000 | uVar3 >> 0x12) + uVar2;
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + data[4] + -0x182c0438 + uVar4;
  uVar4 = (uVar4 * 0x100000 | uVar4 >> 0xc) + uVar3;
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + data[9] + 0x21e1cde6 + uVar1;
  uVar1 = (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + data[0xe] + -0x3cc8f82a + uVar2;
  uVar2 = (uVar2 * 0x200 | uVar2 >> 0x17) + uVar1;
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + data[3] + -0xb2af279 + uVar3;
  uVar3 = (uVar3 * 0x4000 | uVar3 >> 0x12) + uVar2;
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + data[8] + 0x455a14ed + uVar4;
  uVar4 = (uVar4 * 0x100000 | uVar4 >> 0xc) + uVar3;
  uVar1 = (uVar3 ^ uVar2 & (uVar4 ^ uVar3)) + data[0xd] + -0x561c16fb + uVar1;
  uVar1 = (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar4;
  uVar2 = (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + data[2] + -0x3105c08 + uVar2;
  uVar2 = (uVar2 * 0x200 | uVar2 >> 0x17) + uVar1;
  uVar3 = (uVar1 ^ uVar4 & (uVar2 ^ uVar1)) + data[7] + 0x676f02d9 + uVar3;
  uVar3 = (uVar3 * 0x4000 | uVar3 >> 0x12) + uVar2;
  uVar4 = (uVar2 ^ uVar1 & (uVar3 ^ uVar2)) + data[0xc] + -0x72d5b376 + uVar4;
  uVar4 = (uVar4 * 0x100000 | uVar4 >> 0xc) + uVar3;
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + data[5] + -0x5c6be + uVar1;
  uVar1 = (uVar1 * 0x10 | uVar1 >> 0x1c) + uVar4;
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + data[8] + -0x788e097f + uVar2;
  uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) + uVar1;
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + data[0xb] + 0x6d9d6122 + uVar3;
  uVar3 = (uVar3 * 0x10000 | uVar3 >> 0x10) + uVar2;
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + data[0xe] + -0x21ac7f4 + uVar4;
  uVar4 = (uVar4 * 0x800000 | uVar4 >> 9) + uVar3;
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + data[1] + -0x5b4115bc + uVar1;
  uVar1 = (uVar1 * 0x10 | uVar1 >> 0x1c) + uVar4;
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + data[4] + 0x4bdecfa9 + uVar2;
  uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) + uVar1;
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + data[7] + -0x944b4a0 + uVar3;
  uVar3 = (uVar3 * 0x10000 | uVar3 >> 0x10) + uVar2;
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + data[10] + -0x41404390 + uVar4;
  uVar4 = (uVar4 * 0x800000 | uVar4 >> 9) + uVar3;
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + data[0xd] + 0x289b7ec6 + uVar1;
  uVar1 = (uVar1 * 0x10 | uVar1 >> 0x1c) + uVar4;
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + *data + -0x155ed806 + uVar2;
  uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) + uVar1;
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + data[3] + -0x2b10cf7b + uVar3;
  uVar3 = (uVar3 * 0x10000 | uVar3 >> 0x10) + uVar2;
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + data[6] + 0x4881d05 + uVar4;
  uVar4 = (uVar4 * 0x800000 | uVar4 >> 9) + uVar3;
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + data[9] + -0x262b2fc7 + uVar1;
  uVar1 = (uVar1 * 0x10 | uVar1 >> 0x1c) + uVar4;
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + data[0xc] + -0x1924661b + uVar2;
  uVar2 = (uVar2 * 0x800 | uVar2 >> 0x15) + uVar1;
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + data[0xf] + 0x1fa27cf8 + uVar3;
  uVar3 = (uVar3 * 0x10000 | uVar3 >> 0x10) + uVar2;
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + data[2] + -0x3b53a99b + uVar4;
  uVar4 = (uVar4 * 0x800000 | uVar4 >> 9) + uVar3;
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + *data + -0xbd6ddbc + uVar1;
  uVar1 = (uVar1 * 0x40 | uVar1 >> 0x1a) + uVar4;
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + data[7] + 0x432aff97 + uVar2;
  uVar2 = (uVar2 * 0x400 | uVar2 >> 0x16) + uVar1;
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + data[0xe] + -0x546bdc59 + uVar3;
  uVar3 = (uVar3 * 0x8000 | uVar3 >> 0x11) + uVar2;
  uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + data[5] + -0x36c5fc7 + uVar4;
  uVar4 = (uVar4 * 0x200000 | uVar4 >> 0xb) + uVar3;
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + data[0xc] + 0x655b59c3 + uVar1;
  uVar1 = (uVar1 * 0x40 | uVar1 >> 0x1a) + uVar4;
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + data[3] + -0x70f3336e + uVar2;
  uVar2 = (uVar2 * 0x400 | uVar2 >> 0x16) + uVar1;
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + data[10] + -0x100b83 + uVar3;
  uVar3 = (uVar3 * 0x8000 | uVar3 >> 0x11) + uVar2;
  uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + data[1] + -0x7a7ba22f + uVar4;
  uVar4 = (uVar4 * 0x200000 | uVar4 >> 0xb) + uVar3;
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + data[8] + 0x6fa87e4f + uVar1;
  uVar1 = (uVar1 * 0x40 | uVar1 >> 0x1a) + uVar4;
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + data[0xf] + -0x1d31920 + uVar2;
  uVar2 = (uVar2 * 0x400 | uVar2 >> 0x16) + uVar1;
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + data[6] + -0x5cfebcec + uVar3;
  uVar5 = (uVar3 * 0x8000 | uVar3 >> 0x11) + uVar2;
  uVar4 = (uVar2 ^ (uVar5 | uVar1 ^ 0xffffffff)) + data[0xd] + 0x4e0811a1 + uVar4;
  uVar6 = (uVar4 * 0x200000 | uVar4 >> 0xb) + uVar5;
  uVar1 = (uVar5 ^ (uVar6 | uVar2 ^ 0xffffffff)) + data[4] + -0x8ac817e + uVar1;
  uVar4 = (uVar1 * 0x40 | uVar1 >> 0x1a) + uVar6;
  uVar2 = (uVar6 ^ (uVar4 | uVar5 ^ 0xffffffff)) + data[0xb] + -0x42c50dcb + uVar2;
  uVar3 = (uVar2 * 0x400 | uVar2 >> 0x16) + uVar4;
  uVar5 = (uVar4 ^ (uVar3 | uVar6 ^ 0xffffffff)) + data[2] + 0x2ad7d2bb + uVar5;
  uVar2 = (uVar5 * 0x8000 | uVar5 >> 0x11) + uVar3;
  uVar6 = (uVar3 ^ (uVar2 | uVar4 ^ 0xffffffff)) + data[9] + -0x14792c6f + uVar6;
  ctx->hash[0] = uVar4 + ctx->hash[0];
  ctx->hash[1] = (uVar6 * 0x200000 | uVar6 >> 0xb) + uVar2 + ctx->hash[1];
  ctx->hash[2] = uVar2 + ctx->hash[2];
  ctx->hash[3] = uVar3 + ctx->hash[3];
  return;
}

Assistant:

static void
pp_crypto_hash_md5_process (PHashMD5		*ctx,
			    const puint32	data[16])
{
	puint32	A;
	puint32	B;
	puint32	C;
	puint32	D;

	A = ctx->hash[0];
	B = ctx->hash[1];
	C = ctx->hash[2];
	D = ctx->hash[3];

	P_MD5_ROUND_0 (A, B, C, D, 0,  0xD76AA478,  7);
	P_MD5_ROUND_0 (D, A, B, C, 1,  0xE8C7B756, 12);
	P_MD5_ROUND_0 (C, D, A, B, 2,  0x242070DB, 17);
	P_MD5_ROUND_0 (B, C, D, A, 3,  0xC1BDCEEE, 22);
	P_MD5_ROUND_0 (A, B, C, D, 4,  0xF57C0FAF,  7);
	P_MD5_ROUND_0 (D, A, B, C, 5,  0x4787C62A, 12);
	P_MD5_ROUND_0 (C, D, A, B, 6,  0xA8304613, 17);
	P_MD5_ROUND_0 (B, C, D, A, 7,  0xFD469501, 22);
	P_MD5_ROUND_0 (A, B, C, D, 8,  0x698098D8,  7);
	P_MD5_ROUND_0 (D, A, B, C, 9,  0x8B44F7AF, 12);
	P_MD5_ROUND_0 (C, D, A, B, 10, 0xFFFF5BB1, 17);
	P_MD5_ROUND_0 (B, C, D, A, 11, 0x895CD7BE, 22);
	P_MD5_ROUND_0 (A, B, C, D, 12, 0x6B901122,  7);
	P_MD5_ROUND_0 (D, A, B, C, 13, 0xFD987193, 12);
	P_MD5_ROUND_0 (C, D, A, B, 14, 0xA679438E, 17);
	P_MD5_ROUND_0 (B, C, D, A, 15, 0x49B40821, 22);

	P_MD5_ROUND_1 (A, B, C, D, 1,  0xF61E2562,  5);
	P_MD5_ROUND_1 (D, A, B, C, 6,  0xC040B340,  9);
	P_MD5_ROUND_1 (C, D, A, B, 11, 0x265E5A51, 14);
	P_MD5_ROUND_1 (B, C, D, A, 0,  0xE9B6C7AA, 20);
	P_MD5_ROUND_1 (A, B, C, D, 5,  0xD62F105D,  5);
	P_MD5_ROUND_1 (D, A, B, C, 10, 0x02441453,  9);
	P_MD5_ROUND_1 (C, D, A, B, 15, 0xD8A1E681, 14);
	P_MD5_ROUND_1 (B, C, D, A, 4,  0xE7D3FBC8, 20);
	P_MD5_ROUND_1 (A, B, C, D, 9,  0x21E1CDE6,  5);
	P_MD5_ROUND_1 (D, A, B, C, 14, 0xC33707D6,  9);
	P_MD5_ROUND_1 (C, D, A, B, 3,  0xF4D50D87, 14);
	P_MD5_ROUND_1 (B, C, D, A, 8,  0x455A14ED, 20);
	P_MD5_ROUND_1 (A, B, C, D, 13, 0xA9E3E905,  5);
	P_MD5_ROUND_1 (D, A, B, C, 2,  0xFCEFA3F8,  9);
	P_MD5_ROUND_1 (C, D, A, B, 7,  0x676F02D9, 14);
	P_MD5_ROUND_1 (B, C, D, A, 12, 0x8D2A4C8A, 20);

	P_MD5_ROUND_2 (A, B, C, D, 5,  0xFFFA3942,  4);
	P_MD5_ROUND_2 (D, A, B, C, 8,  0x8771F681, 11);
	P_MD5_ROUND_2 (C, D, A, B, 11, 0x6D9D6122, 16);
	P_MD5_ROUND_2 (B, C, D, A, 14, 0xFDE5380C, 23);
	P_MD5_ROUND_2 (A, B, C, D, 1,  0xA4BEEA44,  4);
	P_MD5_ROUND_2 (D, A, B, C, 4,  0x4BDECFA9, 11);
	P_MD5_ROUND_2 (C, D, A, B, 7,  0xF6BB4B60, 16);
	P_MD5_ROUND_2 (B, C, D, A, 10, 0xBEBFBC70, 23);
	P_MD5_ROUND_2 (A, B, C, D, 13, 0x289B7EC6,  4);
	P_MD5_ROUND_2 (D, A, B, C, 0,  0xEAA127FA, 11);
	P_MD5_ROUND_2 (C, D, A, B, 3,  0xD4EF3085, 16);
	P_MD5_ROUND_2 (B, C, D, A, 6,  0x04881D05, 23);
	P_MD5_ROUND_2 (A, B, C, D, 9,  0xD9D4D039,  4);
	P_MD5_ROUND_2 (D, A, B, C, 12, 0xE6DB99E5, 11);
	P_MD5_ROUND_2 (C, D, A, B, 15, 0x1FA27CF8, 16);
	P_MD5_ROUND_2 (B, C, D, A, 2,  0xC4AC5665, 23);

	P_MD5_ROUND_3 (A, B, C, D, 0,  0xF4292244,  6);
	P_MD5_ROUND_3 (D, A, B, C, 7,  0x432AFF97, 10);
	P_MD5_ROUND_3 (C, D, A, B, 14, 0xAB9423A7, 15);
	P_MD5_ROUND_3 (B, C, D, A, 5,  0xFC93A039, 21);
	P_MD5_ROUND_3 (A, B, C, D, 12, 0x655B59C3,  6);
	P_MD5_ROUND_3 (D, A, B, C, 3,  0x8F0CCC92, 10);
	P_MD5_ROUND_3 (C, D, A, B, 10, 0xFFEFF47D, 15);
	P_MD5_ROUND_3 (B, C, D, A, 1,  0x85845DD1, 21);
	P_MD5_ROUND_3 (A, B, C, D, 8,  0x6FA87E4F,  6);
	P_MD5_ROUND_3 (D, A, B, C, 15, 0xFE2CE6E0, 10);
	P_MD5_ROUND_3 (C, D, A, B, 6,  0xA3014314, 15);
	P_MD5_ROUND_3 (B, C, D, A, 13, 0x4E0811A1, 21);
	P_MD5_ROUND_3 (A, B, C, D, 4,  0xF7537E82,  6);
	P_MD5_ROUND_3 (D, A, B, C, 11, 0xBD3AF235, 10);
	P_MD5_ROUND_3 (C, D, A, B, 2,  0x2AD7D2BB, 15);
	P_MD5_ROUND_3 (B, C, D, A, 9,  0xEB86D391, 21);

	ctx->hash[0] += A;
	ctx->hash[1] += B;
	ctx->hash[2] += C;
	ctx->hash[3] += D;
}